

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix2f.cpp
# Opt level: O0

Matrix2f operator*(Matrix2f *x,Matrix2f *y)

{
  float fVar1;
  float fVar2;
  undefined1 auVar3 [16];
  float *pfVar4;
  Matrix2f *in_RDX;
  Matrix2f *in_RSI;
  Matrix2f *in_RDI;
  undefined1 auVar5 [64];
  undefined1 in_ZMM1 [64];
  Matrix2f MVar6;
  int k;
  int j;
  int i;
  Matrix2f *product;
  undefined4 local_24;
  undefined4 local_20;
  undefined4 local_1c;
  
  auVar5 = ZEXT1664((undefined1  [16])0x0);
  Matrix2f::Matrix2f(in_RDI,0.0);
  for (local_1c = 0; local_1c < 2; local_1c = local_1c + 1) {
    for (local_20 = 0; local_20 < 2; local_20 = local_20 + 1) {
      for (local_24 = 0; local_24 < 2; local_24 = local_24 + 1) {
        pfVar4 = Matrix2f::operator()(in_RSI,local_1c,local_20);
        fVar1 = *pfVar4;
        pfVar4 = Matrix2f::operator()(in_RDX,local_20,local_24);
        fVar2 = *pfVar4;
        pfVar4 = Matrix2f::operator()(in_RDI,local_1c,local_24);
        in_ZMM1 = ZEXT464((uint)fVar1);
        auVar3 = vfmadd213ss_fma(ZEXT416((uint)fVar2),ZEXT416((uint)fVar1),ZEXT416((uint)*pfVar4));
        auVar5 = ZEXT1664(auVar3);
        *pfVar4 = auVar3._0_4_;
      }
    }
  }
  MVar6.m_elements._0_8_ = auVar5._0_8_;
  MVar6.m_elements._8_8_ = in_ZMM1._0_8_;
  return (Matrix2f)MVar6.m_elements;
}

Assistant:

Matrix2f operator * ( const Matrix2f& x, const Matrix2f& y )
{
	Matrix2f product; // zeroes

	for( int i = 0; i < 2; ++i )
	{
		for( int j = 0; j < 2; ++j )
		{
			for( int k = 0; k < 2; ++k )
			{
				product( i, k ) += x( i, j ) * y( j, k );
			}
		}
	}

	return product;
}